

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall
QGraphicsTextItem::paint
          (QGraphicsTextItem *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  int iVar1;
  QRectF *pQVar2;
  long in_FS_OFFSET;
  qreal qVar3;
  double dVar4;
  undefined1 local_48 [16];
  qreal local_38;
  qreal qStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (**(long **)(this + 0x20) != 0) {
    QPainter::save();
    local_48._0_8_ = (option->exposedRect).xp;
    local_48._8_8_ = (option->exposedRect).yp;
    qVar3 = (option->exposedRect).w;
    qStack_30 = (option->exposedRect).h;
    iVar1 = *(int *)(*(undefined8 **)(this + 0x20) + 5);
    local_38 = qVar3;
    QWidgetTextControl::document((QWidgetTextControl *)**(undefined8 **)(this + 0x20));
    QTextDocument::pageSize();
    dVar4 = -qVar3 * (double)iVar1;
    QPainter::translate((QPointF *)painter);
    iVar1 = *(int *)(*(undefined8 **)(this + 0x20) + 5);
    QWidgetTextControl::document((QWidgetTextControl *)**(undefined8 **)(this + 0x20));
    QTextDocument::pageSize();
    dVar4 = dVar4 * (double)iVar1 + (double)local_48._8_8_;
    local_48._8_4_ = SUB84(dVar4,0);
    local_48._0_8_ = (double)local_48._0_8_ + 0.0;
    local_48._12_4_ = (int)((ulong)dVar4 >> 0x20);
    QWidgetTextControl::document((QWidgetTextControl *)**(undefined8 **)(this + 0x20));
    QTextDocument::documentLayout();
    pQVar2 = (QRectF *)QMetaObject::cast((QObject *)&QTextDocumentLayout::staticMetaObject);
    if (pQVar2 == (QRectF *)0x0) {
      QWidgetTextControl::drawContents
                ((QWidgetTextControl *)**(undefined8 **)(this + 0x20),painter,(QRectF *)local_48,
                 (QWidget *)0x0);
    }
    else {
      QTextDocumentLayout::setViewport(pQVar2);
      QWidgetTextControl::drawContents
                ((QWidgetTextControl *)**(undefined8 **)(this + 0x20),painter,(QRectF *)local_48,
                 (QWidget *)0x0);
      QTextDocumentLayout::setViewport(pQVar2);
    }
    QPainter::restore();
  }
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x8100) != 0) {
    qt_graphicsItem_highlightSelected((QGraphicsItem *)(this + 0x10),painter,option);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsTextItem::paint(QPainter *painter, const QStyleOptionGraphicsItem *option,
                              QWidget *widget)
{
    Q_UNUSED(widget);
    if (dd->control) {
        painter->save();
        QRectF r = option->exposedRect;
        painter->translate(-dd->controlOffset());
        r.translate(dd->controlOffset());

        QTextDocument *doc = dd->control->document();
        QTextDocumentLayout *layout = qobject_cast<QTextDocumentLayout *>(doc->documentLayout());

        // the layout might need to expand the root frame to
        // the viewport if NoWrap is set
        if (layout)
            layout->setViewport(dd->boundingRect);

        dd->control->drawContents(painter, r);

        if (layout)
            layout->setViewport(QRect());

        painter->restore();
    }

    if (option->state & (QStyle::State_Selected | QStyle::State_HasFocus))
        qt_graphicsItem_highlightSelected(this, painter, option);
}